

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArealObjectStatePdu.cpp
# Opt level: O2

int __thiscall DIS::ArealObjectStatePdu::getMarshalledSize(ArealObjectStatePdu *this)

{
  double *pdVar1;
  pointer pVVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  Vector3Double listElement;
  
  iVar3 = SyntheticEnvironmentFamilyPdu::getMarshalledSize
                    (&this->super_SyntheticEnvironmentFamilyPdu);
  iVar4 = EntityID::getMarshalledSize(&this->_objectID);
  iVar5 = EntityID::getMarshalledSize(&this->_referencedObjectID);
  iVar6 = EntityType::getMarshalledSize(&this->_objectType);
  iVar7 = SixByteChunk::getMarshalledSize(&this->_objectAppearance);
  iVar8 = SimulationAddress::getMarshalledSize(&this->_requesterID);
  iVar9 = SimulationAddress::getMarshalledSize(&this->_receivingID);
  iVar3 = iVar8 + iVar7 + iVar6 + iVar5 + iVar4 + iVar3 + iVar9 + 6;
  lVar11 = 8;
  for (uVar10 = 0;
      pVVar2 = (this->_objectLocation).
               super__Vector_base<DIS::Vector3Double,_std::allocator<DIS::Vector3Double>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar10 < (ulong)((long)(this->_objectLocation).
                             super__Vector_base<DIS::Vector3Double,_std::allocator<DIS::Vector3Double>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar2 >> 5);
      uVar10 = uVar10 + 1) {
    listElement._vptr_Vector3Double = (_func_int **)&PTR__Vector3Double_001b2778;
    listElement._z = *(double *)((long)&pVVar2->_y + lVar11);
    pdVar1 = (double *)((long)&pVVar2->_vptr_Vector3Double + lVar11);
    listElement._x = *pdVar1;
    listElement._y = pdVar1[1];
    iVar4 = Vector3Double::getMarshalledSize(&listElement);
    iVar3 = iVar3 + iVar4;
    Vector3Double::~Vector3Double(&listElement);
    lVar11 = lVar11 + 0x20;
  }
  return iVar3;
}

Assistant:

int ArealObjectStatePdu::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = SyntheticEnvironmentFamilyPdu::getMarshalledSize();
   marshalSize = marshalSize + _objectID.getMarshalledSize();  // _objectID
   marshalSize = marshalSize + _referencedObjectID.getMarshalledSize();  // _referencedObjectID
   marshalSize = marshalSize + 2;  // _updateNumber
   marshalSize = marshalSize + 1;  // _forceID
   marshalSize = marshalSize + 1;  // _modifications
   marshalSize = marshalSize + _objectType.getMarshalledSize();  // _objectType
   marshalSize = marshalSize + _objectAppearance.getMarshalledSize();  // _objectAppearance
   marshalSize = marshalSize + 2;  // _numberOfPoints
   marshalSize = marshalSize + _requesterID.getMarshalledSize();  // _requesterID
   marshalSize = marshalSize + _receivingID.getMarshalledSize();  // _receivingID

   for(unsigned long long idx=0; idx < _objectLocation.size(); idx++)
   {
        Vector3Double listElement = _objectLocation[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }

    return marshalSize;
}